

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O0

TBoard * makeBoard(TBoard *__return_storage_ptr__,short k)

{
  short k_local;
  
  __return_storage_ptr__->_M_elems[0]._M_elems[0] =
       (int)((long)((ulong)(uint)((int)((long)(int)k / (long)(int)g_factors[0]) >> 0x1f) << 0x20 |
                   (long)(int)k / (long)(int)g_factors[0] & 0xffffffffU) % 3);
  __return_storage_ptr__->_M_elems[0]._M_elems[1] =
       (int)((long)((ulong)(uint)((int)((long)(int)k / (long)(int)g_factors[1]) >> 0x1f) << 0x20 |
                   (long)(int)k / (long)(int)g_factors[1] & 0xffffffffU) % 3);
  __return_storage_ptr__->_M_elems[0]._M_elems[2] =
       (int)((long)((ulong)(uint)((int)((long)(int)k / (long)(int)g_factors[2]) >> 0x1f) << 0x20 |
                   (long)(int)k / (long)(int)g_factors[2] & 0xffffffffU) % 3);
  __return_storage_ptr__->_M_elems[1]._M_elems[0] =
       (int)((long)((ulong)(uint)((int)((long)(int)k / (long)(int)g_factors[3]) >> 0x1f) << 0x20 |
                   (long)(int)k / (long)(int)g_factors[3] & 0xffffffffU) % 3);
  __return_storage_ptr__->_M_elems[1]._M_elems[1] =
       (int)((long)((ulong)(uint)((int)((long)(int)k / (long)(int)g_factors[4]) >> 0x1f) << 0x20 |
                   (long)(int)k / (long)(int)g_factors[4] & 0xffffffffU) % 3);
  __return_storage_ptr__->_M_elems[1]._M_elems[2] =
       (int)((long)((ulong)(uint)((int)((long)(int)k / (long)(int)g_factors[5]) >> 0x1f) << 0x20 |
                   (long)(int)k / (long)(int)g_factors[5] & 0xffffffffU) % 3);
  __return_storage_ptr__->_M_elems[2]._M_elems[0] =
       (int)((long)((ulong)(uint)((int)((long)(int)k / (long)(int)g_factors[6]) >> 0x1f) << 0x20 |
                   (long)(int)k / (long)(int)g_factors[6] & 0xffffffffU) % 3);
  __return_storage_ptr__->_M_elems[2]._M_elems[1] =
       (int)((long)((ulong)(uint)((int)((long)(int)k / (long)(int)g_factors[7]) >> 0x1f) << 0x20 |
                   (long)(int)k / (long)(int)g_factors[7] & 0xffffffffU) % 3);
  __return_storage_ptr__->_M_elems[2]._M_elems[2] =
       (int)((long)((ulong)(uint)((int)((long)(int)k / (long)(int)g_factors[8]) >> 0x1f) << 0x20 |
                   (long)(int)k / (long)(int)g_factors[8] & 0xffffffffU) % 3);
  return __return_storage_ptr__;
}

Assistant:

TBoard
makeBoard(short k)
{
    return {{{{k / g_factors[0] % 3, k / g_factors[1] % 3, k / g_factors[2] % 3}},
             {{k / g_factors[3] % 3, k / g_factors[4] % 3, k / g_factors[5] % 3}},
             {{k / g_factors[6] % 3, k / g_factors[7] % 3, k / g_factors[8] % 3}}}};
}